

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<bool>::
GetDescriberImpl<testing::internal::MatcherBase<bool>::ValuePolicy<testing::internal::EqMatcher<bool>,true>>
          (MatcherBase<bool> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<bool>_*,_const_EqMatcher<bool>_*>_> *ppMVar1;
  MatcherBase<bool> *local_28;
  tuple<const_testing::internal::MatcherBase<bool>_*,_const_testing::internal::EqMatcher<bool>_*>
  local_20;
  MatcherBase<bool> *local_10;
  MatcherBase<bool> *m_local;
  
  local_28 = m;
  local_10 = m;
  ValuePolicy<testing::internal::EqMatcher<bool>,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<bool>const*,testing::internal::EqMatcher<bool>const*>
            ((MatcherBase<bool> **)&local_20,(EqMatcher<bool> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<bool>const*,testing::internal::EqMatcher<bool>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }